

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  FILE *pFVar2;
  undefined8 uVar3;
  char *pcVar4;
  undefined4 in_register_0000003c;
  undefined8 uVar5;
  char *pcVar6;
  ulong uVar7;
  
  init((EVP_PKEY_CTX *)CONCAT44(in_register_0000003c,argc));
  cur_file = "stdin";
  pFVar2 = _stdin;
  if (1 < argc) {
    uVar7 = 1;
    do {
      cur_file = argv[uVar7];
      pFVar2 = fopen(argv[uVar7],"r");
      if (pFVar2 == (FILE *)0x0) {
        pcVar4 = argv[uVar7];
        iVar1 = strcmp(pcVar4,"--help");
        if (iVar1 == 0) {
          usage();
          pFVar2 = (FILE *)0x0;
          goto LAB_00104e01;
        }
        iVar1 = strcmp(pcVar4,"-");
        if (iVar1 == 0) {
          iVar1 = restorestdin();
          if (iVar1 != -1) {
            cur_file = "stdin";
            pFVar2 = _stdin;
            goto LAB_00104e01;
          }
        }
        else {
          warn("%s",pcVar4);
          if (argc != 2) {
            fputc(10,_stderr);
          }
        }
      }
      else {
LAB_00104e01:
        yyrestart((FILE *)pFVar2);
        fflush(_stdout);
        fflush(_stderr);
        if (argc != 2) {
          uVar3 = 0x22;
          if (pFVar2 == _stdin) {
            uVar3 = 0x28;
          }
          uVar5 = 0x22;
          if (pFVar2 == _stdin) {
            uVar5 = 0x29;
          }
          pcVar4 = "\x1b[1m";
          if (stdout_in_tty == 0) {
            pcVar4 = "";
          }
          pcVar6 = "\x1b[0m";
          if (stdout_in_tty == 0) {
            pcVar6 = "";
          }
          printf("%sFile name: %c%s%c%s\n",pcVar4,uVar3,cur_file,uVar5,pcVar6);
        }
        yyparse();
        if (error_state == 0) {
          semchecker();
        }
        if (argc != 2) {
          putchar(10);
        }
        if (pFVar2 != _stdin) {
          fclose(pFVar2);
        }
        restart();
      }
      uVar7 = uVar7 + 1;
    } while ((uint)argc != uVar7);
    pFVar2 = (FILE *)0x0;
  }
  if (pFVar2 != (FILE *)0x0) {
    yyrestart((FILE *)pFVar2);
    yyparse();
  }
  return error_state;
}

Assistant:

int main(int argc, char *argv[]) {
#if COMPILER_VERSION >= 3
    if (argc < 3)
        usage();
    FILE *infile = fopen(argv[1], "r");
    if (!infile)
        err(EXIT_FAILURE, "%s", argv[1]);
    output_file = argv[2];
    yyrestart(infile);
    yyparse();
    if (!error_state)
        semchecker();
    if (!error_state) {
        genIR();
#if COMPILER_VERSION >= 4
        genCode();
#endif
    }
#else
    init();
    FILE *infile = stdin; /* use stdin if no arg supplied */
    cur_file = "stdin";
    int i;
    for (i = 1; i < argc; i++) {
        cur_file = argv[i];
        if (!(infile = fopen(argv[i], "r"))) {
            if (strcmp(argv[i], "--help") == 0)
                usage();
            else if (strcmp(argv[i], "-") == 0) {
                if (restorestdin() == -1)
                    continue;
                cur_file = "stdin";
                infile = stdin;
            } else {
                warn("%s", argv[i]);
                if (argc != 2) fputc('\n', stderr);
                continue;
            }
        }
        yyrestart(infile);
        fflush(stdout);
        fflush(stderr);
        if (argc != 2) {
            printf("%sFile name: %c%s%c%s\n",
                   stdout_in_tty ? "\033[1m" : "",
                   infile != stdin ? '"' : '(', cur_file,
                   infile != stdin ? '"' : ')',
                   stdout_in_tty ? "\033[0m" : "");
        }
        yyparse();
#if COMPILER_VERSION >= 2
        if (!error_state)
            semchecker();
#endif
        if (argc != 2) putchar('\n');
        if (infile != stdin) fclose(infile);
        infile = NULL;
        restart();
    }
    if (infile) { /* no args, read stdin */
        yyrestart(infile);
        yyparse();
    }
#endif
    return error_state;
}